

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.c
# Opt level: O3

size_t WebRtc_WriteBuffer(RingBuffer *self,void *data,size_t element_count)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (data == (void *)0x0 || self == (RingBuffer *)0x0) {
    uVar6 = 0;
  }
  else {
    sVar1 = self->element_count;
    if (self->rw_wrap == SAME_WRAP) {
      sVar4 = self->write_pos;
      lVar2 = sVar4 - self->read_pos;
    }
    else {
      sVar4 = self->write_pos;
      lVar2 = (sVar1 - self->read_pos) + sVar4;
    }
    uVar6 = sVar1 - lVar2;
    if (element_count <= sVar1 - lVar2) {
      uVar6 = element_count;
    }
    uVar3 = sVar1 - sVar4;
    uVar5 = uVar6;
    if (uVar3 <= uVar6 && uVar6 - uVar3 != 0) {
      memcpy(self->data + sVar4 * self->element_size,data,uVar3 * self->element_size);
      self->write_pos = 0;
      self->rw_wrap = DIFF_WRAP;
      sVar4 = 0;
      uVar5 = uVar6 - uVar3;
    }
    sVar1 = self->element_size;
    memcpy(self->data + sVar4 * sVar1,(void *)((long)data + (uVar6 - uVar5) * sVar1),sVar1 * uVar5);
    self->write_pos = self->write_pos + uVar5;
  }
  return uVar6;
}

Assistant:

size_t WebRtc_WriteBuffer(RingBuffer* self,
                          const void* data,
                          size_t element_count) {
  if (!self) {
    return 0;
  }
  if (!data) {
    return 0;
  }

  {
    const size_t free_elements = WebRtc_available_write(self);
    const size_t write_elements = (free_elements < element_count ? free_elements
        : element_count);
    size_t n = write_elements;
    const size_t margin = self->element_count - self->write_pos;

    if (write_elements > margin) {
      // Buffer wrap around when writing.
      memcpy(self->data + self->write_pos * self->element_size,
             data, margin * self->element_size);
      self->write_pos = 0;
      n -= margin;
      self->rw_wrap = DIFF_WRAP;
    }
    memcpy(self->data + self->write_pos * self->element_size,
           ((const char*) data) + ((write_elements - n) * self->element_size),
           n * self->element_size);
    self->write_pos += n;

    return write_elements;
  }
}